

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error tt_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  FT_Stream stream;
  FT_Memory memory;
  GX_Blend pGVar1;
  short sVar2;
  FT_Byte FVar3;
  FT_UInt16 FVar4;
  FT_UInt16 FVar5;
  FT_UInt32 FVar6;
  uint uVar7;
  FT_Pointer P;
  GX_VarRegion pGVar8;
  GX_AxisCoords pGVar9;
  GX_ItemVarData pGVar10;
  undefined6 extraout_var;
  FT_UInt *pFVar11;
  FT_ItemVarDelta *pFVar12;
  int iVar13;
  ulong uVar14;
  FT_Fixed *pFVar15;
  FT_Error error;
  FT_Error local_7c;
  ulong local_78;
  uint local_6c;
  GX_ItemVarStore local_68;
  undefined8 local_60;
  undefined4 local_54;
  ulong local_50;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  stream = (face->root).stream;
  memory = stream->memory;
  pGVar1 = face->blend;
  local_7c = FT_Stream_Seek(stream,offset);
  if ((local_7c == 0) && (FVar4 = FT_Stream_ReadUShort(stream,&local_7c), local_7c == 0)) {
    if (FVar4 == 1) {
      FVar6 = FT_Stream_ReadULong(stream,&local_7c);
      if (local_7c == 0) {
        local_78 = CONCAT44(local_78._4_4_,FVar6);
        FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
        if (local_7c == 0) {
          if (FVar4 != 0) {
            local_6c = (uint)FVar4;
            local_40 = (ulong)local_6c;
            P = ft_mem_qrealloc(memory,8,0,local_40,(void *)0x0,&local_7c);
            if (local_7c == 0) {
              local_78 = local_78 & 0xffffffff;
              uVar14 = 0;
              local_68 = itemStore;
              do {
                FVar6 = FT_Stream_ReadULong(stream,&local_7c);
                *(ulong *)((long)P + uVar14 * 8) = (ulong)FVar6;
                if (local_7c != 0) goto LAB_00254676;
                uVar14 = uVar14 + 1;
              } while (local_40 != uVar14);
              local_7c = FT_Stream_Seek(stream,local_78 + offset);
              if (((local_7c == 0) &&
                  (FVar4 = FT_Stream_ReadUShort(stream,&local_7c), local_7c == 0)) &&
                 (FVar5 = FT_Stream_ReadUShort(stream,&local_7c), local_7c == 0)) {
                local_60 = (ulong)FVar4;
                if ((pGVar1->mmvar->num_axis == (uint)FVar4) &&
                   (local_68->axisCount = FVar4, -1 < (short)FVar5)) {
                  pGVar8 = (GX_VarRegion)
                           ft_mem_realloc(memory,8,0,(ulong)FVar5,(void *)0x0,&local_7c);
                  local_68->varRegionList = pGVar8;
                  if (local_7c == 0) {
                    local_68->regionCount = (uint)FVar5;
                    if (FVar5 != 0) {
                      local_50 = 0;
                      do {
                        pGVar9 = (GX_AxisCoords)
                                 ft_mem_realloc(memory,0x18,0,local_60,(void *)0x0,&local_7c);
                        local_68->varRegionList[local_50].axisList = pGVar9;
                        if (local_7c != 0) goto LAB_00254676;
                        if (local_68->axisCount != 0) {
                          pFVar15 = &pGVar9->endCoord;
                          local_78 = 0;
                          do {
                            FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
                            local_54 = CONCAT22(local_54._2_2_,FVar4);
                            if (((local_7c != 0) ||
                                (FVar4 = FT_Stream_ReadUShort(stream,&local_7c), local_7c != 0)) ||
                               (FVar5 = FT_Stream_ReadUShort(stream,&local_7c), local_7c != 0))
                            goto LAB_00254676;
                            ((GX_AxisCoordsRec_ *)(pFVar15 + -2))->startCoord =
                                 (long)(short)local_54 << 2;
                            pFVar15[-1] = (long)(short)FVar4 << 2;
                            *pFVar15 = (long)(short)FVar5 << 2;
                            local_78 = local_78 + 1;
                            pFVar15 = pFVar15 + 3;
                          } while (local_78 < local_68->axisCount);
                        }
                        local_50 = local_50 + 1;
                      } while (local_50 < local_68->regionCount);
                    }
                    pGVar10 = (GX_ItemVarData)
                              ft_mem_realloc(memory,0x18,0,local_40,(void *)0x0,&local_7c);
                    local_68->varData = pGVar10;
                    if (local_7c == 0) {
                      local_68->dataCount = local_6c;
                      local_50 = 0;
                      while( true ) {
                        pGVar10 = local_68->varData + local_50;
                        local_7c = FT_Stream_Seek(stream,*(long *)((long)P + local_50 * 8) + offset)
                        ;
                        if (local_7c != 0) break;
                        FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
                        local_78 = CONCAT62(local_78._2_6_,FVar4);
                        if (local_7c != 0) break;
                        FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
                        local_54 = (undefined4)CONCAT62(extraout_var,FVar4);
                        if ((local_7c != 0) ||
                           (FVar4 = FT_Stream_ReadUShort(stream,&local_7c), local_7c != 0)) break;
                        local_60 = CONCAT44(local_60._4_4_,local_54) & 0xffffffff00007fff;
                        if ((FVar4 < ((ushort)local_54 & 0x7fff)) ||
                           (local_6c = (uint)FVar4, local_68->regionCount < local_6c))
                        goto LAB_00254694;
                        pFVar11 = (FT_UInt *)
                                  ft_mem_realloc(memory,4,0,(ulong)local_6c,(void *)0x0,&local_7c);
                        pGVar10->regionIndices = pFVar11;
                        if (local_7c != 0) break;
                        pGVar10->regionIdxCount = local_6c;
                        if (local_6c != 0) {
                          uVar14 = 0;
                          do {
                            FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
                            pGVar10->regionIndices[uVar14] = (uint)FVar4;
                            if (local_7c != 0) goto LAB_00254676;
                            if (local_68->regionCount < (uint)FVar4 ||
                                local_68->regionCount == (uint)FVar4) goto LAB_00254694;
                            uVar14 = uVar14 + 1;
                          } while (uVar14 < pGVar10->regionIdxCount);
                        }
                        uVar7 = (uint)(ushort)local_78;
                        local_38 = (ulong)(local_6c * uVar7);
                        pFVar12 = (FT_ItemVarDelta *)
                                  ft_mem_realloc(memory,4,0,local_38,(void *)0x0,&local_7c);
                        pGVar10->deltaSet = pFVar12;
                        if (local_7c != 0) break;
                        pGVar10->itemCount = uVar7;
                        if ((uint)local_38 != 0) {
                          local_44 = local_6c - (uint)local_60;
                          local_78 = local_78 & 0xffffffff00000000;
                          do {
                            sVar2 = (short)local_60;
                            if ((short)local_54 < 0) {
                              iVar13 = (uint)local_60;
                              if (sVar2 == 0) {
                                uVar7 = 0;
                              }
                              else {
                                do {
                                  FVar6 = FT_Stream_ReadULong(stream,&local_7c);
                                  pGVar10->deltaSet[local_78 & 0xffffffff] = FVar6;
                                  if (local_7c != 0) goto LAB_00254676;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar13 = iVar13 + -1;
                                } while (iVar13 != 0);
                                uVar7 = (uint)local_60;
                              }
                              iVar13 = local_44;
                              if (uVar7 < local_6c) {
                                do {
                                  FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
                                  pGVar10->deltaSet[local_78 & 0xffffffff] = (int)(short)FVar4;
                                  if (local_7c != 0) goto LAB_00254676;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar13 = iVar13 + -1;
                                } while (iVar13 != 0);
                              }
                            }
                            else {
                              iVar13 = (uint)local_60;
                              if (sVar2 == 0) {
                                uVar7 = 0;
                              }
                              else {
                                do {
                                  FVar4 = FT_Stream_ReadUShort(stream,&local_7c);
                                  pGVar10->deltaSet[local_78 & 0xffffffff] = (int)(short)FVar4;
                                  if (local_7c != 0) goto LAB_00254676;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar13 = iVar13 + -1;
                                } while (iVar13 != 0);
                                uVar7 = (uint)local_60;
                              }
                              iVar13 = local_44;
                              if (uVar7 < local_6c) {
                                do {
                                  FVar3 = FT_Stream_ReadByte(stream,&local_7c);
                                  pGVar10->deltaSet[local_78 & 0xffffffff] = (int)(char)FVar3;
                                  if (local_7c != 0) goto LAB_00254676;
                                  local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                                  iVar13 = iVar13 + -1;
                                } while (iVar13 != 0);
                              }
                            }
                          } while ((uint)local_78 < (uint)local_38);
                        }
                        local_50 = local_50 + 1;
                        if (local_50 == local_40) break;
                      }
                    }
                  }
                }
                else {
LAB_00254694:
                  local_7c = 8;
                }
              }
            }
            goto LAB_00254676;
          }
          goto LAB_0025466b;
        }
      }
    }
    else {
LAB_0025466b:
      local_7c = 8;
    }
  }
  P = (void *)0x0;
LAB_00254676:
  ft_mem_free(memory,P);
  return local_7c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;

    FT_UInt    data_count;
    FT_UShort  axis_count;
    FT_UInt    region_count;

    FT_UInt  i, j, k;
    FT_Bool  long_words;

    GX_Blend   blend           = face->blend;
    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset ) ||
         FT_READ_USHORT( data_count )   )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !data_count )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_QNEW_ARRAY( dataOffsetArray, data_count ) )
      goto Exit;

    for ( i = 0; i < data_count; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( axis_count )   ||
         FT_READ_USHORT( region_count ) )
      goto Exit;

    if ( axis_count != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " number of axes in item variation store\n" ));
      FT_TRACE2(( "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }
    itemStore->axisCount = axis_count;

    /* new constraint in OpenType 1.8.4 */
    if ( region_count >= 32768U )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " too many variation region tables\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, region_count ) )
      goto Exit;
    itemStore->regionCount = region_count;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList, axis_count ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, data_count ) )
      goto Exit;
    itemStore->dataCount = data_count;

    for ( i = 0; i < data_count; i++ )
    {
      GX_ItemVarData  varData = &itemStore->varData[i];

      FT_UInt  item_count;
      FT_UInt  word_delta_count;
      FT_UInt  region_idx_count;


      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( item_count )       ||
           FT_READ_USHORT( word_delta_count ) ||
           FT_READ_USHORT( region_idx_count ) )
        goto Exit;

      long_words        = !!( word_delta_count & 0x8000 );
      word_delta_count &= 0x7FFF;

      /* check some data consistency */
      if ( word_delta_count > region_idx_count )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    word_delta_count,
                    region_idx_count ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( region_idx_count > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    region_idx_count,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices, region_idx_count ) )
        goto Exit;
      varData->regionIdxCount = region_idx_count;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                  */
      /*                                                                   */
      /* On input, deltas are (word_delta_count + region_idx_count) bytes  */
      /* each if `long_words` isn't set, and twice as much otherwise.      */
      /*                                                                   */
      /* On output, deltas are expanded to `region_idx_count` shorts each. */
      if ( FT_NEW_ARRAY( varData->deltaSet, item_count * region_idx_count ) )
        goto Exit;
      varData->itemCount = item_count;

      for ( j = 0; j < item_count * region_idx_count; )
      {
        if ( long_words )
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_LONG( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
        }
        else
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_CHAR( varData->deltaSet[j] ) )
              goto Exit;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }